

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O0

void WriteDebugMetrics(ofstream *stream,Metrics *metrics)

{
  void *pvVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  ulong *in_RSI;
  void *in_RDI;
  int i;
  int local_14;
  
  pvVar1 = (void *)std::ostream::operator<<(in_RDI,*in_RSI);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,in_RSI[1]);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,in_RSI[2]);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
  sVar2 = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::size
                    ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                     (in_RSI + 3));
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,sVar2);
  std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
  local_14 = 0;
  while( true ) {
    sVar2 = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::size
                      ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *
                       )(in_RSI + 3));
    if (sVar2 <= (ulong)(long)local_14) break;
    pvVar3 = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
             operator[]((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                         *)(in_RSI + 3),(long)local_14);
    poVar4 = (ostream *)std::ostream::operator<<(in_RDI,pvVar3->first);
    poVar4 = std::operator<<(poVar4,";");
    pvVar3 = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
             operator[]((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                         *)(in_RSI + 3),(long)local_14);
    pvVar1 = (void *)std::ostream::operator<<(poVar4,pvVar3->second);
    std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void WriteDebugMetrics(ofstream& stream, Meter::Metrics& metrics)
{
    stream << metrics.gold << endl << metrics.predicted << endl << metrics.predictedGold << endl << metrics.scoreVsTrue.size() << endl;
    for (int i = 0; i<metrics.scoreVsTrue.size(); ++i) {
        stream << metrics.scoreVsTrue[i].first << ";" << metrics.scoreVsTrue[i].second << endl;
    }
}